

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<float>
          (internal *this,char *expected_expression,char *actual_expression,float expected,
          float actual)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  stringstream local_380 [8];
  stringstream expected_ss;
  long local_370;
  undefined8 auStack_368 [46];
  stringstream local_1f8 [8];
  stringstream actual_ss;
  long local_1e8;
  undefined8 auStack_1e0 [46];
  string local_70;
  string local_50;
  FloatingPointUnion local_30;
  FloatingPointUnion local_2c;
  FloatingPoint<float> lhs;
  FloatingPoint<float> rhs;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_30.value_ = expected;
  local_2c.value_ = actual;
  lhs.u_ = (FloatingPointUnion)expected;
  bVar1 = FloatingPoint<float>::AlmostEquals
                    ((FloatingPoint<float> *)&local_30,(FloatingPoint<float> *)&local_2c);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_380);
    *(undefined8 *)((long)auStack_368 + *(long *)(local_370 + -0x18)) = 8;
    std::ostream::operator<<(&local_370,(float)lhs.u_);
    std::__cxx11::stringstream::stringstream(local_1f8);
    *(undefined8 *)((long)auStack_1e0 + *(long *)(local_1e8 + -0x18)) = 8;
    std::ostream::operator<<(&local_1e8,actual);
    StringStreamToString(&local_70,(stringstream *)local_380);
    StringStreamToString(&local_50,(stringstream *)local_1f8);
    EqFailure(this,expected_expression,actual_expression,&local_70,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::stringstream::~stringstream(local_1f8);
    std::__cxx11::stringstream::~stringstream(local_380);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* expected_expression,
                                         const char* actual_expression,
                                         RawType expected,
                                         RawType actual) {
  const FloatingPoint<RawType> lhs(expected), rhs(actual);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream expected_ss;
  expected_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
              << expected;

  ::std::stringstream actual_ss;
  actual_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
            << actual;

  return EqFailure(expected_expression,
                   actual_expression,
                   StringStreamToString(&expected_ss),
                   StringStreamToString(&actual_ss),
                   false);
}